

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_csv_parser.hpp
# Opt level: O0

void __thiscall
csv::internals::ThreadSafeDeque<csv::CSVRow>::ThreadSafeDeque
          (ThreadSafeDeque<csv::CSVRow> *this,size_t notify_size)

{
  size_t notify_size_local;
  ThreadSafeDeque<csv::CSVRow> *this_local;
  
  this->_is_waitable = false;
  this->_notify_size = notify_size;
  std::mutex::mutex(&this->_lock);
  std::condition_variable::condition_variable(&this->_cond);
  std::deque<csv::CSVRow,_std::allocator<csv::CSVRow>_>::deque(&this->data);
  return;
}

Assistant:

ThreadSafeDeque(const ThreadSafeDeque& other) {
                this->data = other.data;
                this->_notify_size = other._notify_size;
            }